

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O2

LispPTR make_atom(char *char_base,DLword offset,DLword length)

{
  byte bVar1;
  ulong uVar2;
  DLword *pDVar3;
  DLword *pDVar4;
  DLword *pDVar5;
  DLword DVar6;
  LispPTR LVar7;
  undefined6 in_register_00000012;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined6 in_register_00000032;
  uint uVar12;
  uint uVar13;
  
  uVar8 = CONCAT62(in_register_00000012,length);
  uVar10 = CONCAT62(in_register_00000032,offset) & 0xffffffff;
  if ((int)uVar8 == 0) {
    uVar12 = 0xff;
    uVar9 = uVar8;
    uVar2 = uVar8;
  }
  else {
    bVar1 = char_base[uVar10];
    uVar12 = (uint)bVar1;
    if ((int)uVar8 == 1) {
      if (0x39 < bVar1) {
        return uVar12 - 8;
      }
      if (0x2f < bVar1) {
        return uVar12 + 0xdffd0;
      }
      return uVar12 + 2;
    }
    DVar6 = compute_hash(char_base,offset,length);
    uVar9 = uVar8 & 0xffffffff;
    uVar2 = (ulong)DVar6;
  }
  pDVar5 = AtomSpace;
  pDVar4 = AtomHT;
  pDVar3 = Lisp_world;
  uVar11 = uVar2 & 0xffffffff;
  do {
    if (*(ushort *)((ulong)(pDVar4 + (uVar11 & 0xffff)) ^ 2) == 0) {
      return 0xffffffff;
    }
    uVar13 = *(ushort *)((ulong)(pDVar4 + (uVar11 & 0xffff)) ^ 2) - 1 & 0xffff;
    if ((ushort)*(byte *)((ulong)(pDVar3 + (*(uint *)((long)pDVar5 + (ulong)(uVar13 * 0x14)) &
                                           0xfffffff)) ^ 3) == (ushort)uVar9) {
      LVar7 = compare_chars((char *)((long)(pDVar3 + (*(uint *)((long)pDVar5 +
                                                               (ulong)(uVar13 * 0x14)) & 0xfffffff))
                                    + 1),char_base + uVar10,length);
      uVar9 = uVar8 & 0xffffffff;
      if (LVar7 != 0) {
        return uVar13;
      }
    }
    uVar11 = (ulong)((int)uVar11 + ((uVar12 ^ (uint)uVar2) & 0x3e) + 1);
  } while( true );
}

Assistant:

LispPTR make_atom(const char *char_base, DLword offset, DLword length)
{
  DLword hash;
  LispPTR hash_entry; /* hash entry contents */
  DLword atom_index;
  DLword reprobe;

  PNCell *pnptr;
  char *pname_base;
  unsigned short first_char;

#ifdef TRACE2
  printf("TRACE: make_atom( %s , offset= %d, len= %d)\n", char_base, offset, length);
#endif

  first_char = (*(char_base + offset)) & 0xff;
  switch (length) {
  case 0:
    /* the zero-length atom has hashcode 0 */
    hash = 0;
    first_char = 255;
    break;

  case 1:
    /* One-character atoms live in well known places, no need to hash */
    if (first_char > '9')
      return ((LispPTR)(ATOMoffset + (first_char - 10)));
    if (first_char >= '0' ) /* 0..9 */
      return ((LispPTR)(S_POSITIVE + (first_char - '0')));
    /* other one character atoms */
    return ((LispPTR)(ATOMoffset + first_char));

  default:
    hash = compute_hash(char_base, offset, length);
    break;
  }

  /* This point corresponds with LP in Lisp source */

  /* following for loop does not exit until it finds new hash entry or same atom */
  for (reprobe = Atom_reprobe(hash, first_char); (hash_entry = GETWORD(AtomHT + hash)) != 0;
       hash = ((hash + reprobe) & 0xffff)) {
    atom_index = (DLword)(hash_entry - 1);
    /* get pname pointer */
    pnptr = (PNCell *)GetPnameCell(atom_index);
    pname_base = (char *)NativeAligned2FromLAddr(POINTERMASK & pnptr->pnamebase);

    if ((length == GETBYTE(pname_base)) &&
        (compare_chars(++pname_base, char_base + offset, length) == T)) {
      DBPRINT(("FOUND the atom. \n"));
      return (atom_index); /* found existing atom */
    }
    DBPRINT(("HASH doesn't hit. reprobe!\n"));

  } /* for end */

  /* we can't find that atom, then we should make new atom */
  DBPRINT(("HASH NEVER HIT.  Returning -1.\n"));
  return (0xffffffff);
  /** Don't create newatom now **/
}